

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration_test.cpp
# Opt level: O0

void __thiscall
configuration_test_DefaultConstructor_Test::TestBody
          (configuration_test_DefaultConstructor_Test *this)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char *pcVar6;
  AssertionResult gtest_ar_27;
  AssertionResult gtest_ar_26;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  value v_4;
  AssertionResult gtest_ar_23;
  configuration child_d;
  char key_value_local_4 [8];
  char name_4 [8];
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  value v_3;
  AssertionResult gtest_ar_18;
  configuration child_c;
  char key_value_local_3 [8];
  char name_3 [8];
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  value v_2;
  AssertionResult gtest_ar_13;
  configuration child_b;
  char key_value_local_2 [8];
  char name_2 [8];
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  value v_1;
  AssertionResult gtest_ar_8;
  configuration child_a;
  char key_value_local_1 [8];
  char name_1 [8];
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  value v;
  AssertionResult gtest_ar_3;
  configuration global;
  char key_value_local [12];
  char name [7];
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  memory_allocator allocator;
  char *configuration_path;
  char key_value [6];
  AssertionResult gtest_ar;
  configuration_type **in_stack_fffffffffffff790;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffff798;
  undefined1 in_stack_fffffffffffff79f;
  char *in_stack_fffffffffffff7a0;
  char *in_stack_fffffffffffff7a8;
  AssertionResult *this_01;
  AssertHelper local_5c0;
  Message local_5b8;
  undefined4 local_5b0;
  undefined4 local_5ac;
  AssertionResult local_5a8;
  AssertHelper local_598;
  Message local_590;
  undefined8 local_588;
  undefined8 local_580;
  AssertionResult local_578;
  AssertHelper local_568;
  Message local_560;
  undefined4 local_558;
  undefined4 local_554;
  AssertionResult local_550;
  AssertHelper local_540;
  Message local_538;
  undefined8 local_530;
  undefined8 local_528;
  AssertionResult local_520;
  undefined8 local_510;
  AssertHelper local_508;
  Message local_500;
  undefined8 local_4f8;
  undefined8 local_4f0;
  AssertionResult local_4e8;
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  AssertHelper local_4c0;
  Message local_4b8;
  undefined4 local_4b0;
  undefined4 local_4ac;
  AssertionResult local_4a8;
  AssertHelper local_498;
  Message local_490;
  undefined8 local_488;
  undefined8 local_480;
  AssertionResult local_478;
  AssertHelper local_468;
  Message local_460;
  undefined4 local_458;
  undefined4 local_454;
  AssertionResult local_450;
  AssertHelper local_440;
  Message local_438;
  undefined8 local_430;
  undefined8 local_428;
  AssertionResult local_420;
  undefined8 local_410;
  AssertHelper local_408;
  Message local_400;
  undefined8 local_3f8;
  undefined8 local_3f0;
  AssertionResult local_3e8;
  undefined8 local_3d8;
  undefined8 local_3d0;
  undefined8 local_3c8;
  AssertHelper local_3c0;
  Message local_3b8;
  undefined4 local_3b0;
  undefined4 local_3ac;
  AssertionResult local_3a8;
  AssertHelper local_398;
  Message local_390;
  undefined8 local_388;
  undefined8 local_380;
  AssertionResult local_378;
  AssertHelper local_368;
  Message local_360;
  undefined4 local_358;
  undefined4 local_354;
  AssertionResult local_350;
  AssertHelper local_340;
  Message local_338;
  undefined8 local_330;
  undefined8 local_328;
  AssertionResult local_320;
  undefined8 local_310;
  AssertHelper local_308;
  Message local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  AssertionResult local_2e8;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  AssertHelper local_2c0;
  Message local_2b8;
  undefined4 local_2b0;
  undefined4 local_2ac;
  AssertionResult local_2a8;
  AssertHelper local_298;
  Message local_290;
  undefined8 local_288;
  undefined8 local_280;
  AssertionResult local_278;
  AssertHelper local_268;
  Message local_260;
  undefined4 local_258;
  undefined4 local_254;
  AssertionResult local_250;
  AssertHelper local_240;
  Message local_238;
  undefined8 local_230;
  undefined8 local_228;
  AssertionResult local_220;
  undefined8 local_210;
  AssertHelper local_208;
  Message local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  AssertionResult local_1e8;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  AssertHelper local_1c0;
  Message local_1b8;
  undefined4 local_1b0;
  undefined4 local_1ac;
  AssertionResult local_1a8;
  AssertHelper local_198;
  Message local_190;
  undefined8 local_188;
  undefined8 local_180;
  AssertionResult local_178;
  AssertHelper local_168;
  Message local_160;
  undefined4 local_158;
  undefined4 local_154;
  AssertionResult local_150;
  AssertHelper local_140;
  Message local_138;
  undefined8 local_130;
  undefined8 local_128;
  AssertionResult local_120;
  undefined8 local_110;
  AssertHelper local_108;
  Message local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  AssertionResult local_e8;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined4 local_c8;
  undefined4 local_c0;
  undefined3 uStack_bc;
  AssertHelper local_b8;
  Message local_b0;
  undefined4 local_a8;
  undefined4 local_a4;
  AssertionResult local_a0;
  uint local_8c;
  AssertHelper local_88;
  Message local_80;
  undefined8 local_78;
  undefined8 local_70;
  AssertionResult local_68;
  undefined8 local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined2 local_44;
  AssertHelper local_40;
  Message local_38 [3];
  undefined4 local_20;
  undefined4 local_1c;
  AssertionResult local_18;
  
  local_1c = 0;
  uVar2 = log_policy_format_text();
  uVar3 = log_policy_schedule_sync();
  uVar4 = log_policy_storage_sequential();
  uVar5 = log_policy_stream_stdio(_stdout);
  local_20 = log_configure_impl("metacall",4,uVar2,uVar3,uVar4,uVar5);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
             (int *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
             (int *)in_stack_fffffffffffff790);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message(local_38);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10bac5);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/configuration_test/source/configuration_test.cpp"
               ,0x2c,pcVar6);
    testing::internal::AssertHelper::operator=(&local_40,local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::Message::~Message((Message *)0x10bb28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bb80);
  local_44 = 0x65;
  local_48 = 0x756c6176;
  local_50 = environment_variable_create("CONFIGURATION_PATH",0);
  local_78 = memory_allocator_std(malloc,realloc,free);
  local_70 = 0;
  local_58 = local_78;
  testing::internal::CmpHelperNE<memory_allocator_type*,memory_allocator_type*>
            (in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
             (memory_allocator_type **)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798)
             ,(memory_allocator_type **)in_stack_fffffffffffff790);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_68);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10bc8d);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/configuration_test/source/configuration_test.cpp"
               ,0x34,pcVar6);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message((Message *)0x10bcf0);
  }
  local_8c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bd5e);
  if (local_8c == 0) {
    local_a4 = 0;
    local_a8 = configuration_initialize("rapid_json",local_50,local_58);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
               (int *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               (int *)in_stack_fffffffffffff790);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a0);
    if (!bVar1) {
      testing::Message::Message(&local_b0);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10be40);
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/configuration_test/source/configuration_test.cpp"
                 ,0x36,pcVar6);
      testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      testing::Message::~Message((Message *)0x10bea3);
    }
    local_8c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bf11);
    if (local_8c == 0) {
      environment_variable_destroy(local_50);
      uStack_bc = 0x6c61;
      local_c0 = 0x626f6c67;
      local_d0 = 0x6f6c5f65756c6176;
      local_c8 = 0x6c6163;
      local_f8 = configuration_scope(&local_c0);
      local_f0 = 0;
      local_d8 = local_f8;
      testing::internal::CmpHelperNE<configuration_type*,configuration_type*>
                (in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                 (configuration_type **)
                 CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
                 in_stack_fffffffffffff790);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
      if (!bVar1) {
        testing::Message::Message(&local_100);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10c036);
        testing::internal::AssertHelper::AssertHelper
                  (&local_108,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/configuration_test/source/configuration_test.cpp"
                   ,0x41,pcVar6);
        testing::internal::AssertHelper::operator=(&local_108,&local_100);
        testing::internal::AssertHelper::~AssertHelper(&local_108);
        testing::Message::~Message((Message *)0x10c099);
      }
      local_8c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c107);
      if (local_8c == 0) {
        local_130 = configuration_value(local_d8,&local_48);
        local_128 = 0;
        local_110 = local_130;
        testing::internal::CmpHelperNE<void*,void*>
                  (in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                   (void **)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
                   in_stack_fffffffffffff790);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_120);
        if (!bVar1) {
          testing::Message::Message(&local_138);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10c1f4);
          testing::internal::AssertHelper::AssertHelper
                    (&local_140,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/configuration_test/source/configuration_test.cpp"
                     ,0x45,pcVar6);
          testing::internal::AssertHelper::operator=(&local_140,&local_138);
          testing::internal::AssertHelper::~AssertHelper(&local_140);
          testing::Message::~Message((Message *)0x10c257);
        }
        local_8c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c2c5);
        if (local_8c == 0) {
          local_154 = 0x3039;
          local_158 = value_to_int(local_110);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    (in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                     (int *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
                     (int *)in_stack_fffffffffffff790);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_150);
          if (!bVar1) {
            testing::Message::Message(&local_160);
            pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10c398);
            testing::internal::AssertHelper::AssertHelper
                      (&local_168,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/configuration_test/source/configuration_test.cpp"
                       ,0x47,pcVar6);
            testing::internal::AssertHelper::operator=(&local_168,&local_160);
            testing::internal::AssertHelper::~AssertHelper(&local_168);
            testing::Message::~Message((Message *)0x10c3fb);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c453);
          local_188 = configuration_value_type(local_d8,&local_d0,3);
          local_180 = 0;
          local_110 = local_188;
          testing::internal::CmpHelperNE<void*,void*>
                    (in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                     (void **)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
                     in_stack_fffffffffffff790);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_178);
          if (!bVar1) {
            testing::Message::Message(&local_190);
            pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10c533);
            testing::internal::AssertHelper::AssertHelper
                      (&local_198,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/configuration_test/source/configuration_test.cpp"
                       ,0x4b,pcVar6);
            testing::internal::AssertHelper::operator=(&local_198,&local_190);
            testing::internal::AssertHelper::~AssertHelper(&local_198);
            testing::Message::~Message((Message *)0x10c596);
          }
          local_8c = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c604);
          if (local_8c == 0) {
            local_1ac = 0x4e729;
            local_1b0 = value_to_int(local_110);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      (in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                       (int *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
                       (int *)in_stack_fffffffffffff790);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a8);
            if (!bVar1) {
              testing::Message::Message(&local_1b8);
              pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10c6d7);
              testing::internal::AssertHelper::AssertHelper
                        (&local_1c0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/configuration_test/source/configuration_test.cpp"
                         ,0x4d,pcVar6);
              testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
              testing::internal::AssertHelper::~AssertHelper(&local_1c0);
              testing::Message::~Message((Message *)0x10c73a);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c792);
            local_1c8 = 0x615f646c696863;
            local_1d0 = 0x615f65756c6176;
            local_1f8 = configuration_scope(&local_1c8);
            local_1f0 = 0;
            local_1d8 = local_1f8;
            testing::internal::CmpHelperNE<configuration_type*,configuration_type*>
                      (in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                       (configuration_type **)
                       CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
                       in_stack_fffffffffffff790);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e8);
            if (!bVar1) {
              testing::Message::Message(&local_200);
              pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10c889);
              testing::internal::AssertHelper::AssertHelper
                        (&local_208,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/configuration_test/source/configuration_test.cpp"
                         ,0x57,pcVar6);
              testing::internal::AssertHelper::operator=(&local_208,&local_200);
              testing::internal::AssertHelper::~AssertHelper(&local_208);
              testing::Message::~Message((Message *)0x10c8ec);
            }
            local_8c = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c95a);
            if (local_8c == 0) {
              local_230 = configuration_value(local_1d8,&local_48);
              local_228 = 0;
              local_210 = local_230;
              testing::internal::CmpHelperNE<void*,void*>
                        (in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                         (void **)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
                         in_stack_fffffffffffff790);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_220);
              if (!bVar1) {
                testing::Message::Message(&local_238);
                pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10ca47);
                testing::internal::AssertHelper::AssertHelper
                          (&local_240,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/configuration_test/source/configuration_test.cpp"
                           ,0x5b,pcVar6);
                testing::internal::AssertHelper::operator=(&local_240,&local_238);
                testing::internal::AssertHelper::~AssertHelper(&local_240);
                testing::Message::~Message((Message *)0x10caaa);
              }
              local_8c = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x10cb18);
              if (local_8c == 0) {
                local_254 = 0x3e66b19;
                local_258 = value_to_int(local_210);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          (in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                           (int *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
                           (int *)in_stack_fffffffffffff790);
                bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_250);
                if (!bVar1) {
                  testing::Message::Message(&local_260);
                  pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10cbeb);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_268,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/configuration_test/source/configuration_test.cpp"
                             ,0x5d,pcVar6);
                  testing::internal::AssertHelper::operator=(&local_268,&local_260);
                  testing::internal::AssertHelper::~AssertHelper(&local_268);
                  testing::Message::~Message((Message *)0x10cc4e);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x10cca6);
                local_288 = configuration_value_type(local_1d8,&local_1d0,3);
                local_280 = 0;
                local_210 = local_288;
                testing::internal::CmpHelperNE<void*,void*>
                          (in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                           (void **)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
                           in_stack_fffffffffffff790);
                bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_278);
                if (!bVar1) {
                  testing::Message::Message(&local_290);
                  pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10cd86);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_298,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/configuration_test/source/configuration_test.cpp"
                             ,0x61,pcVar6);
                  testing::internal::AssertHelper::operator=(&local_298,&local_290);
                  testing::internal::AssertHelper::~AssertHelper(&local_298);
                  testing::Message::~Message((Message *)0x10cde9);
                }
                local_8c = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ce57);
                if (local_8c == 0) {
                  local_2ac = 0x22b;
                  local_2b0 = value_to_int(local_210);
                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                            (in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                             (int *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
                             (int *)in_stack_fffffffffffff790);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2a8);
                  if (!bVar1) {
                    testing::Message::Message(&local_2b8);
                    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10cf2a);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_2c0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/configuration_test/source/configuration_test.cpp"
                               ,99,pcVar6);
                    testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
                    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
                    testing::Message::~Message((Message *)0x10cf8d);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10cfe5);
                  local_2c8 = 0x625f646c696863;
                  local_2d0 = 0x625f65756c6176;
                  local_2f8 = configuration_scope(&local_2c8);
                  local_2f0 = 0;
                  local_2d8 = local_2f8;
                  testing::internal::CmpHelperNE<configuration_type*,configuration_type*>
                            (in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                             (configuration_type **)
                             CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
                             in_stack_fffffffffffff790);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2e8);
                  if (!bVar1) {
                    testing::Message::Message(&local_300);
                    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10d0dc);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_308,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/configuration_test/source/configuration_test.cpp"
                               ,0x6d,pcVar6);
                    testing::internal::AssertHelper::operator=(&local_308,&local_300);
                    testing::internal::AssertHelper::~AssertHelper(&local_308);
                    testing::Message::~Message((Message *)0x10d13f);
                  }
                  local_8c = (uint)!bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d1ad);
                  if (local_8c == 0) {
                    local_330 = configuration_value(local_2d8,&local_48);
                    local_328 = 0;
                    local_310 = local_330;
                    testing::internal::CmpHelperNE<void*,void*>
                              (in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                               (void **)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798
                                                ),in_stack_fffffffffffff790);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_320);
                    if (!bVar1) {
                      testing::Message::Message(&local_338);
                      pcVar6 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)0x10d29a);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_340,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/configuration_test/source/configuration_test.cpp"
                                 ,0x71,pcVar6);
                      testing::internal::AssertHelper::operator=(&local_340,&local_338);
                      testing::internal::AssertHelper::~AssertHelper(&local_340);
                      testing::Message::~Message((Message *)0x10d2fd);
                    }
                    local_8c = (uint)!bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d36b);
                    if (local_8c == 0) {
                      local_354 = 0xd431;
                      local_358 = value_to_int(local_310);
                      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                (in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                                 (int *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798
                                                ),(int *)in_stack_fffffffffffff790);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_350);
                      if (!bVar1) {
                        testing::Message::Message(&local_360);
                        pcVar6 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)0x10d43e);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_368,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/configuration_test/source/configuration_test.cpp"
                                   ,0x73,pcVar6);
                        testing::internal::AssertHelper::operator=(&local_368,&local_360);
                        testing::internal::AssertHelper::~AssertHelper(&local_368);
                        testing::Message::~Message((Message *)0x10d4a1);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d4f9);
                      local_388 = configuration_value_type(local_2d8,&local_2d0,3);
                      local_380 = 0;
                      local_310 = local_388;
                      testing::internal::CmpHelperNE<void*,void*>
                                (in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                                 (void **)CONCAT17(in_stack_fffffffffffff79f,
                                                   in_stack_fffffffffffff798),
                                 in_stack_fffffffffffff790);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_378);
                      if (!bVar1) {
                        testing::Message::Message(&local_390);
                        pcVar6 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)0x10d5d9);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_398,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/configuration_test/source/configuration_test.cpp"
                                   ,0x77,pcVar6);
                        testing::internal::AssertHelper::operator=(&local_398,&local_390);
                        testing::internal::AssertHelper::~AssertHelper(&local_398);
                        testing::Message::~Message((Message *)0x10d63c);
                      }
                      local_8c = (uint)!bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d6aa);
                      if (local_8c == 0) {
                        local_3ac = 0x14d;
                        local_3b0 = value_to_int(local_310);
                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                  (in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                                   (int *)CONCAT17(in_stack_fffffffffffff79f,
                                                   in_stack_fffffffffffff798),
                                   (int *)in_stack_fffffffffffff790);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3a8);
                        if (!bVar1) {
                          testing::Message::Message(&local_3b8);
                          pcVar6 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)0x10d77d);
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_3c0,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/configuration_test/source/configuration_test.cpp"
                                     ,0x79,pcVar6);
                          testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
                          testing::internal::AssertHelper::~AssertHelper(&local_3c0);
                          testing::Message::~Message((Message *)0x10d7e0);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d838);
                        local_3c8 = 0x635f646c696863;
                        local_3d0 = 0x635f65756c6176;
                        local_3f8 = configuration_scope(&local_3c8);
                        local_3f0 = 0;
                        local_3d8 = local_3f8;
                        testing::internal::CmpHelperNE<configuration_type*,configuration_type*>
                                  (in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                                   (configuration_type **)
                                   CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
                                   in_stack_fffffffffffff790);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3e8);
                        if (!bVar1) {
                          testing::Message::Message(&local_400);
                          pcVar6 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)0x10d92f);
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_408,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/configuration_test/source/configuration_test.cpp"
                                     ,0x83,pcVar6);
                          testing::internal::AssertHelper::operator=(&local_408,&local_400);
                          testing::internal::AssertHelper::~AssertHelper(&local_408);
                          testing::Message::~Message((Message *)0x10d992);
                        }
                        local_8c = (uint)!bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)0x10da00);
                        if (local_8c == 0) {
                          local_430 = configuration_value(local_3d8,&local_48);
                          local_428 = 0;
                          local_410 = local_430;
                          testing::internal::CmpHelperNE<void*,void*>
                                    (in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                                     (void **)CONCAT17(in_stack_fffffffffffff79f,
                                                       in_stack_fffffffffffff798),
                                     in_stack_fffffffffffff790);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_420);
                          if (!bVar1) {
                            testing::Message::Message(&local_438);
                            pcVar6 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)0x10daed);
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_440,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/configuration_test/source/configuration_test.cpp"
                                       ,0x87,pcVar6);
                            testing::internal::AssertHelper::operator=(&local_440,&local_438);
                            testing::internal::AssertHelper::~AssertHelper(&local_440);
                            testing::Message::~Message((Message *)0x10db50);
                          }
                          local_8c = (uint)!bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)0x10dbbe);
                          if (local_8c == 0) {
                            local_454 = 0x457;
                            local_458 = value_to_int(local_410);
                            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                      (in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                                       (int *)CONCAT17(in_stack_fffffffffffff79f,
                                                       in_stack_fffffffffffff798),
                                       (int *)in_stack_fffffffffffff790);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_450);
                            if (!bVar1) {
                              testing::Message::Message(&local_460);
                              pcVar6 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)0x10dc91);
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_468,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/configuration_test/source/configuration_test.cpp"
                                         ,0x89,pcVar6);
                              testing::internal::AssertHelper::operator=(&local_468,&local_460);
                              testing::internal::AssertHelper::~AssertHelper(&local_468);
                              testing::Message::~Message((Message *)0x10dcf4);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)0x10dd4c);
                            local_488 = configuration_value_type(local_3d8,&local_3d0,3);
                            local_480 = 0;
                            local_410 = local_488;
                            testing::internal::CmpHelperNE<void*,void*>
                                      (in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                                       (void **)CONCAT17(in_stack_fffffffffffff79f,
                                                         in_stack_fffffffffffff798),
                                       in_stack_fffffffffffff790);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_478);
                            if (!bVar1) {
                              testing::Message::Message(&local_490);
                              pcVar6 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)0x10de2c);
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_498,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/configuration_test/source/configuration_test.cpp"
                                         ,0x8d,pcVar6);
                              testing::internal::AssertHelper::operator=(&local_498,&local_490);
                              testing::internal::AssertHelper::~AssertHelper(&local_498);
                              testing::Message::~Message((Message *)0x10de8f);
                            }
                            local_8c = (uint)!bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)0x10defd);
                            if (local_8c == 0) {
                              local_4ac = 0x1f90;
                              local_4b0 = value_to_int(local_410);
                              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                        (in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                                         (int *)CONCAT17(in_stack_fffffffffffff79f,
                                                         in_stack_fffffffffffff798),
                                         (int *)in_stack_fffffffffffff790);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4a8);
                              if (!bVar1) {
                                testing::Message::Message(&local_4b8);
                                pcVar6 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)0x10dfd0);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_4c0,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/configuration_test/source/configuration_test.cpp"
                                           ,0x8f,pcVar6);
                                testing::internal::AssertHelper::operator=(&local_4c0,&local_4b8);
                                testing::internal::AssertHelper::~AssertHelper(&local_4c0);
                                testing::Message::~Message((Message *)0x10e02d);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)0x10e085);
                              local_4c8 = 0x645f646c696863;
                              local_4d0 = 0x645f65756c6176;
                              local_4f8 = configuration_scope(&local_4c8);
                              local_4f0 = 0;
                              local_4d8 = local_4f8;
                              testing::internal::
                              CmpHelperNE<configuration_type*,configuration_type*>
                                        (in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                                         (configuration_type **)
                                         CONCAT17(in_stack_fffffffffffff79f,
                                                  in_stack_fffffffffffff798),
                                         in_stack_fffffffffffff790);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4e8);
                              if (!bVar1) {
                                testing::Message::Message(&local_500);
                                pcVar6 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)0x10e170);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_508,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/configuration_test/source/configuration_test.cpp"
                                           ,0x99,pcVar6);
                                testing::internal::AssertHelper::operator=(&local_508,&local_500);
                                testing::internal::AssertHelper::~AssertHelper(&local_508);
                                testing::Message::~Message((Message *)0x10e1cd);
                              }
                              local_8c = (uint)!bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)0x10e23b);
                              if (local_8c == 0) {
                                local_530 = configuration_value(local_4d8,&local_48);
                                local_528 = 0;
                                local_510 = local_530;
                                testing::internal::CmpHelperNE<void*,void*>
                                          (in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                                           (void **)CONCAT17(in_stack_fffffffffffff79f,
                                                             in_stack_fffffffffffff798),
                                           in_stack_fffffffffffff790);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_520);
                                if (!bVar1) {
                                  testing::Message::Message(&local_538);
                                  pcVar6 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)0x10e31c);
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_540,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/configuration_test/source/configuration_test.cpp"
                                             ,0x9d,pcVar6);
                                  testing::internal::AssertHelper::operator=(&local_540,&local_538);
                                  testing::internal::AssertHelper::~AssertHelper(&local_540);
                                  testing::Message::~Message((Message *)0x10e379);
                                }
                                local_8c = (uint)!bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)0x10e3e7);
                                if (local_8c == 0) {
                                  local_554 = 0x56ce;
                                  local_558 = value_to_int(local_510);
                                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                            (in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                                             (int *)CONCAT17(in_stack_fffffffffffff79f,
                                                             in_stack_fffffffffffff798),
                                             (int *)in_stack_fffffffffffff790);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    (&local_550);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_560);
                                    pcVar6 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)0x10e4ae);
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_568,kNonFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/configuration_test/source/configuration_test.cpp"
                                               ,0x9f,pcVar6);
                                    testing::internal::AssertHelper::operator=
                                              (&local_568,&local_560);
                                    testing::internal::AssertHelper::~AssertHelper(&local_568);
                                    testing::Message::~Message((Message *)0x10e50b);
                                  }
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)0x10e563);
                                  local_588 = configuration_value_type(local_4d8,&local_4d0,3);
                                  local_580 = 0;
                                  this_01 = &local_578;
                                  local_510 = local_588;
                                  testing::internal::CmpHelperNE<void*,void*>
                                            (&this_01->success_,in_stack_fffffffffffff7a0,
                                             (void **)CONCAT17(in_stack_fffffffffffff79f,
                                                               in_stack_fffffffffffff798),
                                             in_stack_fffffffffffff790);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_590);
                                    in_stack_fffffffffffff7a0 =
                                         testing::AssertionResult::failure_message
                                                   ((AssertionResult *)0x10e637);
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_598,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/configuration_test/source/configuration_test.cpp"
                                               ,0xa3,in_stack_fffffffffffff7a0);
                                    testing::internal::AssertHelper::operator=
                                              (&local_598,&local_590);
                                    testing::internal::AssertHelper::~AssertHelper(&local_598);
                                    testing::Message::~Message((Message *)0x10e694);
                                  }
                                  local_8c = (uint)!bVar1;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)0x10e702);
                                  if (local_8c == 0) {
                                    local_5ac = 999999;
                                    local_5b0 = value_to_int(local_510);
                                    this_00 = &local_5a8;
                                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                              (&this_01->success_,in_stack_fffffffffffff7a0,
                                               (int *)CONCAT17(in_stack_fffffffffffff79f,
                                                               in_stack_fffffffffffff798),
                                               (int *)this_00);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00)
                                    ;
                                    if (!bVar1) {
                                      testing::Message::Message(&local_5b8);
                                      pcVar6 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)0x10e7c9);
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_5c0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/configuration_test/source/configuration_test.cpp"
                                                 ,0xa5,pcVar6);
                                      testing::internal::AssertHelper::operator=
                                                (&local_5c0,&local_5b8);
                                      testing::internal::AssertHelper::~AssertHelper(&local_5c0);
                                      testing::Message::~Message((Message *)0x10e824);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)0x10e879);
                                    configuration_destroy();
                                    memory_allocator_destroy(local_58);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(configuration_test, DefaultConstructor)
{
	EXPECT_EQ((int)0, (int)log_configure("metacall",
						  log_policy_format_text(),
						  log_policy_schedule_sync(),
						  log_policy_storage_sequential(),
						  log_policy_stream_stdio(stdout)));

	const char key_value[] = "value";

	char *configuration_path = environment_variable_create(CONFIGURATION_PATH, NULL);

	memory_allocator allocator = memory_allocator_std(&std::malloc, &std::realloc, &std::free);

	ASSERT_NE((memory_allocator)NULL, (memory_allocator)allocator);

	ASSERT_EQ((int)0, (int)configuration_initialize("rapid_json", configuration_path, allocator));

	environment_variable_destroy(configuration_path);

	/* Global */
	{
		const char name[] = "global";
		const char key_value_local[] = "value_local";

		configuration global = configuration_scope(name);

		ASSERT_NE((configuration)NULL, (configuration)global);

		value v = configuration_value(global, key_value);

		ASSERT_NE((value)NULL, (value)v);

		EXPECT_EQ((int)12345, (int)value_to_int(v));

		v = configuration_value_type(global, key_value_local, TYPE_INT);

		ASSERT_NE((value)NULL, (value)v);

		EXPECT_EQ((int)321321, (int)value_to_int(v));
	}

	/* Child A */
	{
		const char name[] = "child_a";
		const char key_value_local[] = "value_a";

		configuration child_a = configuration_scope(name);

		ASSERT_NE((configuration)NULL, (configuration)child_a);

		value v = configuration_value(child_a, key_value);

		ASSERT_NE((value)NULL, (value)v);

		EXPECT_EQ((int)65432345, (int)value_to_int(v));

		v = configuration_value_type(child_a, key_value_local, TYPE_INT);

		ASSERT_NE((value)NULL, (value)v);

		EXPECT_EQ((int)555, (int)value_to_int(v));
	}

	/* Child B */
	{
		const char name[] = "child_b";
		const char key_value_local[] = "value_b";

		configuration child_b = configuration_scope(name);

		ASSERT_NE((configuration)NULL, (configuration)child_b);

		value v = configuration_value(child_b, key_value);

		ASSERT_NE((value)NULL, (value)v);

		EXPECT_EQ((int)54321, (int)value_to_int(v));

		v = configuration_value_type(child_b, key_value_local, TYPE_INT);

		ASSERT_NE((value)NULL, (value)v);

		EXPECT_EQ((int)333, (int)value_to_int(v));
	}

	/* Child C */
	{
		const char name[] = "child_c";
		const char key_value_local[] = "value_c";

		configuration child_c = configuration_scope(name);

		ASSERT_NE((configuration)NULL, (configuration)child_c);

		value v = configuration_value(child_c, key_value);

		ASSERT_NE((value)NULL, (value)v);

		EXPECT_EQ((int)1111, (int)value_to_int(v));

		v = configuration_value_type(child_c, key_value_local, TYPE_INT);

		ASSERT_NE((value)NULL, (value)v);

		EXPECT_EQ((int)8080, (int)value_to_int(v));
	}

	/* Child D */
	{
		const char name[] = "child_d";
		const char key_value_local[] = "value_d";

		configuration child_d = configuration_scope(name);

		ASSERT_NE((configuration)NULL, (configuration)child_d);

		value v = configuration_value(child_d, key_value);

		ASSERT_NE((value)NULL, (value)v);

		EXPECT_EQ((int)22222, (int)value_to_int(v));

		v = configuration_value_type(child_d, key_value_local, TYPE_INT);

		ASSERT_NE((value)NULL, (value)v);

		EXPECT_EQ((int)999999, (int)value_to_int(v));
	}

	configuration_destroy();

	memory_allocator_destroy(allocator);
}